

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

string * __thiscall embree::Camera::str_abi_cxx11_(Camera *this)

{
  ostream *poVar1;
  float *in_RSI;
  char *pcVar2;
  string *in_RDI;
  stringstream stream;
  long local_198 [2];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  std::ios_base::precision((ios_base *)((long)local_198 + *(long *)(local_198[0] + -0x18)),10);
  poVar1 = std::operator<<(local_188,"--vp ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"--vi ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[4]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[5]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[6]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"--vu ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[8]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[9]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[10]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"--fov ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[0xc]);
  poVar1 = std::operator<<(poVar1," ");
  pcVar2 = "--righthanded";
  if (in_RSI[0xd] == 0.0) {
    pcVar2 = "--lefthanded";
  }
  std::operator<<(poVar1,pcVar2);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  return in_RDI;
}

Assistant:

std::string str() const 
    {
      std::stringstream stream;
      stream.precision(10);
      stream << "--vp " << from.x    << " " << from.y    << " " << from.z    << " " 
             << "--vi " << to.x << " " << to.y << " " << to.z << " " 
             << "--vu " << up.x     << " " << up.y     << " " << up.z     << " " 
             << "--fov " << fov << " "
             << (handedness == LEFT_HANDED ? "--lefthanded" : "--righthanded");
      return stream.str();
    }